

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void baryonyx::itm::
     init_with_bastert<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>
               (bit_array *x,quadratic_cost_type<long_double> *c,int variables,int value_if_0)

{
  int extraout_EDX;
  int extraout_EDX_00;
  int index;
  int i;
  uint index_00;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar1;
  
  index = variables;
  for (index_00 = 0; variables != index_00; index_00 = index_00 + 1) {
    quadratic_cost_type<long_double>::operator[]
              ((longdouble *)c,(quadratic_cost_type<long_double> *)(ulong)index_00,index);
    lVar1 = in_ST6;
    if ((in_ST0 < (longdouble)0) || (value_if_0 != 0 && in_ST0 == (longdouble)0)) {
      bit_array_impl::set(&x->super_bit_array_impl,index_00);
      index = extraout_EDX_00;
    }
    else {
      bit_array_impl::unset(&x->super_bit_array_impl,index_00);
      index = extraout_EDX;
    }
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = lVar1;
  }
  return;
}

Assistant:

void
init_with_bastert(bit_array& x,
                  const Cost& c,
                  const int variables,
                  const int value_if_0) noexcept
{
    for (int i = 0; i != variables; ++i)
        if (init_x<Mode>(c[i], value_if_0))
            x.set(i);
        else
            x.unset(i);
}